

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::VarStmt::serialize_(VarStmt *this,JSONWriter *w)

{
  variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_> *pvVar1;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *this_00;
  string_view name;
  string local_30;
  
  name._M_str = "variable";
  name._M_len = 8;
  JSONWriter::key(w,name);
  if (*(__index_type *)
       ((long)&(this->var_).super__Variant_base<hgdb::json::Variable,_unsigned_long>.
               super__Move_assign_alias<hgdb::json::Variable,_unsigned_long>.
               super__Copy_assign_alias<hgdb::json::Variable,_unsigned_long>.
               super__Move_ctor_alias<hgdb::json::Variable,_unsigned_long>.
               super__Copy_ctor_alias<hgdb::json::Variable,_unsigned_long>.
               super__Variant_storage_alias<hgdb::json::Variable,_unsigned_long> + 0x58) != '\0') {
    pvVar1 = std::get<1ul,hgdb::json::Variable,unsigned_long>(&this->var_);
    std::__cxx11::to_string(&local_30,*pvVar1);
    JSONWriter::value<std::__cxx11::string>(w,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  this_00 = std::get<0ul,hgdb::json::Variable,unsigned_long>(&this->var_);
  Variable::serialize(this_00,w);
  return;
}

Assistant:

void serialize_(JSONWriter &w) const override {
        w.key("variable");
        if (var_.index() == 0) {
            std::get<0>(var_).serialize(w);
        } else {
            w.value(std::to_string(std::get<1>(var_)));
        }
    }